

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O1

void decompressBlockTHUMB59Tc
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  byte bVar1;
  long lVar2;
  uint8 y;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  byte local_40 [6];
  byte local_3a;
  byte local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  int local_34;
  uint8 paint_colors [4] [3];
  
  local_34 = startx;
  uVar6 = block_part1 >> 0xb & 0xf;
  uVar4 = block_part1 >> 7 & 0xf;
  uVar12 = block_part1 >> 3 & 0xf;
  uVar14 = (block_part1 >> 0xb) << 4;
  uVar8 = (block_part1 >> 7) << 4;
  uVar12 = uVar12 << 4 | uVar12;
  uVar11 = uVar14 & 0xff | uVar6;
  bVar1 = "\x03\x06\v\x10\x17 )@"[block_part1 & 7];
  iVar13 = uVar11 - bVar1;
  iVar5 = 0;
  local_37 = (undefined1)iVar13;
  if (iVar13 < 1) {
    local_37 = 0;
  }
  uVar7 = uVar8 & 0xff | uVar4;
  iVar13 = uVar7 - bVar1;
  if (iVar13 < 1) {
    iVar13 = iVar5;
  }
  uVar15 = (uint)bVar1;
  iVar10 = uVar12 - uVar15;
  if ((int)(uVar12 - uVar15) < 1) {
    iVar10 = iVar5;
  }
  local_36 = (char)iVar13;
  local_35 = (char)iVar10;
  local_40[0] = (byte)((block_part1 >> 0x17) << 4) | (byte)(block_part1 >> 0x17) & 0xf;
  local_40[1] = (byte)((block_part1 >> 0x13) << 4) | (byte)(block_part1 >> 0x13) & 0xf;
  uVar11 = uVar11 + uVar15;
  if (0xfe < uVar11) {
    uVar11 = 0xff;
  }
  local_40[2] = (byte)((block_part1 >> 0xf) << 4) | (byte)(block_part1 >> 0xf) & 0xf;
  local_40[3] = (char)uVar11;
  uVar7 = uVar7 + uVar15;
  local_40[4] = (byte)uVar7;
  if (0xfe < uVar7) {
    local_40[4] = 0xff;
  }
  local_40[5] = (byte)(uVar12 + uVar15);
  if (0xfe < uVar12 + uVar15) {
    local_40[5] = 0xff;
  }
  local_3a = (byte)uVar14 | (byte)uVar6;
  local_39 = (byte)uVar8 | (byte)uVar4;
  local_38 = (char)uVar12;
  iVar13 = (width * starty + startx) * channels;
  lVar9 = 0;
  do {
    lVar3 = 0;
    iVar10 = iVar13;
    do {
      uVar11 = iVar5 + (int)lVar3;
      lVar2 = (ulong)((uint)((block_part2 >> (uVar11 & 0x1f) & 1) != 0) +
                     (block_part2 >> ((byte)uVar11 & 0x1f | 0x10) & 1) * 2) * 3;
      img[iVar10] = local_40[lVar2];
      img[(long)iVar10 + 1] = local_40[lVar2 + 1];
      img[(long)iVar10 + 2] = local_40[lVar2 + 2];
      lVar3 = lVar3 + 1;
      iVar10 = iVar10 + channels * width;
    } while (lVar3 != 4);
    lVar9 = lVar9 + 1;
    iVar13 = iVar13 + channels;
    iVar5 = iVar5 + 4;
  } while (lVar9 != 4);
  return;
}

Assistant:

void decompressBlockTHUMB59Tc(unsigned int block_part1, unsigned int block_part2, uint8 *img,int width,int height,int startx,int starty, int channels)
{
	uint8 colorsRGB444[2][3];
	uint8 colors[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 58);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 54);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 50);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 46);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 42);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 38);

	distance   = GETBITSHIGH(block_part1, TABLE_BITS_59T, 34);

	// Extend the two colors to RGB888	
	decompressColor(R_BITS59T, G_BITS59T, B_BITS59T, colorsRGB444, colors);	
	calculatePaintColors59T(distance, PATTERN_T, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channels*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channels*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channels*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
		}
	}
}